

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdouble.c
# Opt level: O0

int mpt_cdouble(double *val,char *src,double *range)

{
  char cVar1;
  ushort **ppuVar2;
  double *local_38;
  char *end;
  double tmp;
  double *range_local;
  char *src_local;
  double *val_local;
  
  if (src == (char *)0x0) {
    val_local._4_4_ = -1;
  }
  else if (*src == '\0') {
    val_local._4_4_ = 0;
  }
  else {
    tmp = (double)range;
    range_local = (double *)src;
    src_local = (char *)val;
    end = (char *)strtod(src,(char **)&local_38);
    if (local_38 == range_local) {
      do {
        if (*(char *)range_local == '\0') {
          return 0;
        }
        ppuVar2 = __ctype_b_loc();
        cVar1 = *(char *)range_local;
        range_local = (double *)((long)range_local + 1);
      } while (((*ppuVar2)[(int)cVar1] & 0x2000) != 0);
      val_local._4_4_ = -3;
    }
    else if ((tmp == 0.0) ||
            ((*(double *)tmp <= (double)end &&
             ((double)end < *(double *)((long)tmp + 8) || (double)end == *(double *)((long)tmp + 8))
             ))) {
      if (src_local != (char *)0x0) {
        *(char **)src_local = end;
      }
      val_local._4_4_ = (int)local_38 - (int)range_local;
    }
    else {
      val_local._4_4_ = -2;
    }
  }
  return val_local._4_4_;
}

Assistant:

extern int mpt_cdouble(double *val, const char *src, const double range[2])
{
	double tmp;
	char *end;
	
	if (!src) {
		return MPT_ERROR(BadArgument);
	}
	if (!*src) {
		return 0;
	}
	tmp = strtod(src, &end);
	
	if (end == src) {
		/* accept space as empty string */
		while (*src) {
			if (!isspace(*src++)) {
				return MPT_ERROR(BadType);
			}
		}
		return 0;
	}
	if (range && (range[0] > tmp || tmp > range[1])) {
		return MPT_ERROR(BadValue);
	}
	if (val) {
		*val = tmp;
	}
	return end - src;
}